

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * prvTidyCloneNode(TidyDocImpl *doc,Node *element)

{
  uint uVar1;
  Lexer *lexer;
  Bool BVar2;
  Node *pNVar3;
  tmbstr ptVar4;
  AttVal *pAVar5;
  
  lexer = doc->lexer;
  pNVar3 = prvTidyNewNode(lexer->allocator,lexer);
  uVar1 = lexer->lexsize;
  pNVar3->start = uVar1;
  pNVar3->end = uVar1;
  if (element != (Node *)0x0) {
    pNVar3->parent = element->parent;
    pNVar3->type = element->type;
    BVar2 = element->implicit;
    pNVar3->closed = element->closed;
    pNVar3->implicit = BVar2;
    pNVar3->tag = element->tag;
    ptVar4 = prvTidytmbstrdup(doc->allocator,element->element);
    pNVar3->element = ptVar4;
    pAVar5 = prvTidyDupAttrs(doc,element->attributes);
    pNVar3->attributes = pAVar5;
  }
  return pNVar3;
}

Assistant:

Node *TY_(CloneNode)( TidyDocImpl* doc, Node *element )
{
    Lexer* lexer = doc->lexer;
    Node *node = TY_(NewNode)( lexer->allocator, lexer );

    node->start = lexer->lexsize;
    node->end   = lexer->lexsize;

    if ( element )
    {
        node->parent     = element->parent;
        node->type       = element->type;
        node->closed     = element->closed;
        node->implicit   = element->implicit;
        node->tag        = element->tag;
        node->element    = TY_(tmbstrdup)( doc->allocator, element->element );
        node->attributes = TY_(DupAttrs)( doc, element->attributes );
    }
    return node;
}